

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

unsigned_long * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<unsigned_long>::Iterator::Current(Iterator *this)

{
  unsigned_long *puVar1;
  
  puVar1 = (this->value_).ptr_;
  if (puVar1 != (unsigned_long *)0x0) {
    return puVar1;
  }
  puVar1 = (unsigned_long *)operator_new(8);
  *puVar1 = *(this->iterator_)._M_current;
  scoped_ptr<const_unsigned_long>::reset(&this->value_,puVar1);
  return (this->value_).ptr_;
}

Assistant:

T* get() const { return ptr_; }